

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

double __thiscall flexbuffers::Reference::AsDouble(Reference *this)

{
  uint8_t *data;
  long *plVar1;
  long lVar2;
  ulong *puVar3;
  byte bVar4;
  uint8_t byte_width;
  double dVar5;
  undefined1 auVar6 [16];
  double d;
  double local_30;
  Vector local_28;
  
  dVar5 = 0.0;
  switch(this->type_) {
  case FBT_INT:
    plVar1 = (long *)this->data_;
    bVar4 = this->parent_width_;
    break;
  case FBT_FLOAT:
    data = this->data_;
    byte_width = this->parent_width_;
    goto LAB_0013a624;
  case FBT_KEY:
  case FBT_MAP:
    goto switchD_0013a5d3_caseD_4;
  case FBT_STRING:
    AsString((String *)&local_28,this);
    flatbuffers::StringToFloatImpl<double>
              (&local_30,(char *)local_28.super_Sized.super_Object.data_);
    return local_30;
  case FBT_INDIRECT_INT:
    plVar1 = (long *)Indirect(this);
    bVar4 = this->byte_width_;
    break;
  case FBT_INDIRECT_UINT:
    puVar3 = (ulong *)Indirect(this);
    bVar4 = this->byte_width_;
LAB_0013a68d:
    if (bVar4 < 4) {
      if (bVar4 < 2) {
        local_28.super_Sized.size_ = (size_t)(byte)*puVar3;
      }
      else {
        local_28.super_Sized.size_ = (size_t)(ushort)*puVar3;
      }
    }
    else if (bVar4 < 8) {
      local_28.super_Sized.size_ = (size_t)(uint)*puVar3;
    }
    else {
      local_28.super_Sized.size_ = *puVar3;
    }
LAB_0013a6b2:
    auVar6._8_4_ = (int)(local_28.super_Sized.size_ >> 0x20);
    auVar6._0_8_ = local_28.super_Sized.size_;
    auVar6._12_4_ = 0x45300000;
    return (auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_28.super_Sized.size_) - 4503599627370496.0);
  case FBT_INDIRECT_FLOAT:
    data = Indirect(this);
    byte_width = this->byte_width_;
LAB_0013a624:
    dVar5 = ReadSizedScalar<double,signed_char,short,float,double>(data,byte_width);
    return dVar5;
  case FBT_VECTOR:
    AsVector(&local_28,this);
    goto LAB_0013a6b2;
  default:
    if (this->type_ != FBT_BOOL) {
      return 0.0;
    }
  case FBT_UINT:
    puVar3 = (ulong *)this->data_;
    bVar4 = this->parent_width_;
    goto LAB_0013a68d;
  }
  if (bVar4 < 4) {
    if (bVar4 < 2) {
      lVar2 = (long)(char)*plVar1;
    }
    else {
      lVar2 = (long)(short)*plVar1;
    }
  }
  else if (bVar4 < 8) {
    lVar2 = (long)(int)*plVar1;
  }
  else {
    lVar2 = *plVar1;
  }
  dVar5 = (double)lVar2;
switchD_0013a5d3_caseD_4:
  return dVar5;
}

Assistant:

double AsDouble() const {
    if (type_ == FBT_FLOAT) {
      // A fast path for the common case.
      return ReadDouble(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_FLOAT: return ReadDouble(Indirect(), byte_width_);
        case FBT_INT:
          return static_cast<double>(ReadInt64(data_, parent_width_));
        case FBT_UINT:
          return static_cast<double>(ReadUInt64(data_, parent_width_));
        case FBT_INDIRECT_INT:
          return static_cast<double>(ReadInt64(Indirect(), byte_width_));
        case FBT_INDIRECT_UINT:
          return static_cast<double>(ReadUInt64(Indirect(), byte_width_));
        case FBT_NULL: return 0.0;
        case FBT_STRING: {
          double d;
          flatbuffers::StringToNumber(AsString().c_str(), &d);
          return d;
        }
        case FBT_VECTOR: return static_cast<double>(AsVector().size());
        case FBT_BOOL:
          return static_cast<double>(ReadUInt64(data_, parent_width_));
        default:
          // Convert strings and other things to float.
          return 0;
      }
  }